

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O3

_Bool array_container_is_subset_bitset(array_container_t *container1,bitset_container_t *container2)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = container1->cardinality;
  if (container2->cardinality == -1 || (int)uVar1 <= container2->cardinality) {
    if ((int)uVar1 < 1) {
      return true;
    }
    uVar2 = 0;
    while ((container2->words[container1->array[uVar2] >> 6] >>
            ((ulong)container1->array[uVar2] & 0x3f) & 1) != 0) {
      uVar2 = uVar2 + 1;
      if (uVar1 == uVar2) {
        return uVar1 <= uVar2;
      }
    }
  }
  return false;
}

Assistant:

bool array_container_is_subset_bitset(const array_container_t* container1,
                                      const bitset_container_t* container2) {
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality < container1->cardinality) {
            return false;
        }
    }
    for (int i = 0; i < container1->cardinality; ++i) {
        if (!bitset_container_contains(container2, container1->array[i])) {
            return false;
        }
    }
    return true;
}